

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::IdentityShaderCase::getVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  string source;
  ContextType local_34;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "${VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_vertex_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_vertex_color = vec4(a_position.x * 0.5 + 0.5, a_position.y * 0.5 + 0.5, 1.0, 0.4);\n}\n"
             ,(allocator<char> *)&local_34);
  local_34.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_30,&local_34);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string IdentityShaderCase::getVertexSource (void) const
{
	std::string source =	"${VERSION_DECL}\n"
							"in highp vec4 a_position;\n"
							"out highp vec4 v_vertex_color;\n"
							"void main (void)\n"
							"{\n"
							"	gl_Position = a_position;\n"
							"	v_vertex_color = vec4(a_position.x * 0.5 + 0.5, a_position.y * 0.5 + 0.5, 1.0, 0.4);\n"
							"}\n";

	return specializeShader(source, m_context.getRenderContext().getType());
}